

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.c
# Opt level: O1

int wrapped_fgetc(FILE *stream)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  code *UNRECOVERED_JUMPTABLE;
  curious_file_record_t *pcVar4;
  curious_read_record_t io_args;
  undefined8 local_48;
  undefined4 local_40;
  char *local_38;
  char *local_30;
  undefined4 local_28;
  
  lVar3 = __tls_get_addr(&PTR_0027c768);
  piVar1 = (int *)(lVar3 + 0xc);
  *piVar1 = *piVar1 + 1;
  UNRECOVERED_JUMPTABLE = (code *)gotcha_get_wrappee(io_fns[0x1f].handle);
  if ((*piVar1 == 1) && (wrappers_enabled != 0)) {
    iVar2 = fileno((FILE *)stream);
    pcVar4 = get_curious_file_record(iVar2);
    if (pcVar4 == (curious_file_record_t *)0x0) {
      local_30 = (char *)0x0;
      local_38 = (char *)0x0;
    }
    else {
      local_38 = pcVar4->filesystem;
      local_30 = pcVar4->mount_point;
    }
    local_48 = 0;
    local_40 = 0;
    local_28 = 0x1f;
    curious_call_callbacks(0,&local_48);
    iVar2 = (*UNRECOVERED_JUMPTABLE)(stream);
    local_40 = 1;
    if (iVar2 != -1) {
      local_48 = 1;
    }
    curious_call_callbacks(1,&local_48);
    *piVar1 = *piVar1 + -1;
    return iVar2;
  }
  *piVar1 = *piVar1 + -1;
  iVar2 = (*UNRECOVERED_JUMPTABLE)(stream);
  return iVar2;
}

Assistant:

int wrapped_fgetc(FILE* stream)
{
    WRAPPER_ENTER(fgetc);

    // Get the handle for the original function
    fgetc_f orig_fgetc = (fgetc_f) gotcha_get_wrappee(io_fns[CURIOUS_FGETC_ID].handle);

    // Only call callbacks the first time around
    if (1 == wrapper_call_depth && wrappers_enabled) {
        char*                  filesystem;
        char*                  mount_point;
        curious_file_record_t* record = get_curious_file_record(fileno(stream));
        if (NULL == record) {
            filesystem  = NULL;
            mount_point = NULL;
        } else {
            filesystem  = record->filesystem;
            mount_point = record->mount_point;
        }

        curious_read_record_t io_args = {
            .bytes_read  = 0,
            .call_count  = 0,
            .filesystem  = filesystem,
            .mount_point = mount_point,
            .function_id = CURIOUS_FGETC_ID,
        };
        curious_call_callbacks(CURIOUS_READ_CALLBACK, &io_args);

        // Call the original, saving the result...
        int return_val     = orig_fgetc(stream);
        io_args.call_count = 1;
        if (EOF != return_val) {
            io_args.bytes_read = 1;
        }

        //...for the pot callbacks to use
        curious_call_callbacks(CURIOUS_READ_CALLBACK | CURIOUS_POST_CALLBACK, &io_args);

        WRAPPER_RETURN(return_val, fgetc);

        // and just call the original function every other time
    } else {
        WRAPPER_RETURN(orig_fgetc(stream), fgetc);
    }
}